

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  HashElem *pHVar1;
  size_t sVar2;
  CollSeq *data;
  void *p;
  CollSeq *pCVar3;
  ulong uVar4;
  
  if (zName == (char *)0x0) {
    data = db->pDfltColl;
  }
  else {
    pHVar1 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
    data = (CollSeq *)pHVar1->data;
    if (create != 0 && data == (CollSeq *)0x0) {
      sVar2 = strlen(zName);
      uVar4 = (ulong)((uint)sVar2 & 0x3fffffff);
      data = (CollSeq *)sqlite3DbMallocZero(db,uVar4 + 0x79);
      if (data != (CollSeq *)0x0) {
        pCVar3 = data + 3;
        data->zName = (char *)pCVar3;
        data->enc = '\x01';
        data[1].zName = (char *)pCVar3;
        data[1].enc = '\x02';
        data[2].zName = (char *)pCVar3;
        data[2].enc = '\x03';
        memcpy(pCVar3,zName,uVar4 + 1);
        p = sqlite3HashInsert(&db->aCollSeq,(char *)pCVar3,data);
        if (p == (void *)0x0) goto LAB_0022f503;
        if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
          db->mallocFailed = '\x01';
          if (0 < db->nVdbeExec) {
            (db->u1).isInterrupted = 1;
          }
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        sqlite3DbFreeNN(db,p);
      }
      data = (CollSeq *)0x0;
    }
  }
LAB_0022f503:
  pCVar3 = data + ((ulong)enc - 1);
  if (data == (CollSeq *)0x0) {
    pCVar3 = (CollSeq *)0x0;
  }
  return pCVar3;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,
  u8 enc,
  const char *zName,
  int create
){
  CollSeq *pColl;
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
  }else{
    pColl = db->pDfltColl;
  }
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( pColl ) pColl += enc-1;
  return pColl;
}